

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statisticspooling.cpp
# Opt level: O2

int __thiscall
ncnn::StatisticsPooling::forward(StatisticsPooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  void *pvVar7;
  int _w;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int i_1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  uVar11 = iVar2 * iVar1;
  uVar13 = 0;
  _w = uVar3 << (this->include_stddev != 0);
  Mat::create(top_blob,_w,bottom_blob->elemsize,opt->blob_allocator);
  pvVar7 = bottom_blob->data;
  sVar4 = bottom_blob->cstep;
  pvVar5 = top_blob->data;
  uVar12 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar12 = uVar13;
  }
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  fVar14 = 1.0 / ((float)iVar2 * (float)iVar1);
  sVar6 = bottom_blob->elemsize;
  for (; uVar13 != uVar8; uVar13 = uVar13 + 1) {
    fVar15 = 0.0;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      fVar15 = fVar15 + *(float *)((long)pvVar7 + uVar9 * 4);
    }
    *(float *)((long)pvVar5 + uVar13 * 4) = fVar15 * fVar14;
    pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar6);
  }
  sVar4 = bottom_blob->cstep;
  sVar6 = bottom_blob->elemsize;
  pvVar7 = bottom_blob->data;
  pvVar5 = top_blob->data;
  for (lVar10 = (long)(int)uVar3; lVar10 < _w; lVar10 = lVar10 + 1) {
    fVar15 = 0.0;
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      fVar16 = *(float *)((long)pvVar7 + uVar13 * 4) -
               *(float *)((long)top_blob->data + (lVar10 - (int)uVar3) * 4);
      fVar15 = fVar15 + fVar16 * fVar16;
    }
    *(float *)((long)pvVar5 + lVar10 * 4) = SQRT(fVar15 * fVar14);
    pvVar7 = (void *)((long)pvVar7 + sVar4 * sVar6);
  }
  return 0;
}

Assistant:

int StatisticsPooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;
    size_t elemsize = bottom_blob.elemsize;

    int out_channels = channels;
    if (include_stddev)
    {
        out_channels *= 2;
    }

    top_blob.create(out_channels, elemsize, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float mean = 0.f;
        for (int i = 0; i < size; i++)
        {
            mean += ptr[i];
        }
        top_blob[q] = mean / w / h;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = channels; q < out_channels; q++)
    {
        const float* ptr = bottom_blob.channel(q - channels);

        float std = 0.f;
        for (int i = 0; i < size; i++)
        {
            std += pow((ptr[i] - top_blob[q - channels]), 2);
        }
        top_blob[q] = sqrt(std / w / h);
    }

    return 0;
}